

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::compressPieceTable(QTextDocumentPrivate *this)

{
  uint uVar1;
  Data *pDVar2;
  Header *pHVar3;
  QTextFragmentData *pQVar4;
  uint n;
  char16_t *pcVar5;
  long lVar6;
  int iVar7;
  void *__dest;
  long in_FS_OFFSET;
  QArrayData *local_58;
  void *pvStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->undoEnabled != false) || (this->unreachableCharacterCount < 0xc001)) goto LAB_004d3b4b;
  pDVar2 = (this->text).d.d;
  if ((pDVar2 != (Data *)0x0) &&
     ((double)(this->text).d.size < (double)(pDVar2->super_QArrayData).alloc * 0.9))
  goto LAB_004d3b4b;
  local_58 = (QArrayData *)0x0;
  pvStack_50 = (void *)0x0;
  local_48 = 0;
  QString::resize((longlong)&local_58);
  if ((local_58 == (QArrayData *)0x0) ||
     (1 < (local_58->ref_)._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)&local_58,(AllocationOption)local_48);
  }
  pHVar3 = (this->fragments).data.field_0.head;
  uVar1 = pHVar3->root;
  do {
    n = uVar1;
    if (n == 0) goto LAB_004d3abf;
    uVar1 = *(uint *)((long)pHVar3 + (ulong)n * 0x20 + 4);
  } while (uVar1 != 0);
  iVar7 = 0;
  __dest = pvStack_50;
  do {
    pcVar5 = (this->text).d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    pQVar4 = (this->fragments).data.field_0.fragments;
    memcpy(__dest,pcVar5 + pQVar4[n].stringPosition,
           (ulong)pQVar4[n].super_QFragment<1>.size_array[0] * 2);
    (this->fragments).data.field_0.fragments[n].stringPosition = iVar7;
    uVar1 = (this->fragments).data.field_0.fragments[n].super_QFragment<1>.size_array[0];
    __dest = (void *)((long)__dest + (ulong)uVar1 * 2);
    iVar7 = iVar7 + uVar1;
    n = QFragmentMapData<QTextFragmentData>::next(&(this->fragments).data,n);
  } while (n != 0);
LAB_004d3abf:
  QString::resize((longlong)&local_58);
  if (local_58 != (QArrayData *)0x0) {
    if ((1 < (local_58->ref_)._q_value.super___atomic_base<int>._M_i) ||
       (lVar6 = local_58->alloc, local_48 < lVar6)) {
      QString::reallocData((longlong)&local_58,(AllocationOption)local_48);
      if (local_58 == (QArrayData *)0x0) goto LAB_004d3b10;
      lVar6 = local_58->alloc;
    }
    if (lVar6 != 0) {
      *(byte *)&(local_58->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(local_58->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                 super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
    }
  }
LAB_004d3b10:
  QString::operator=(&this->text,(QString *)&local_58);
  this->unreachableCharacterCount = 0;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
LAB_004d3b4b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::compressPieceTable()
{
    if (undoEnabled)
        return;

    const uint garbageCollectionThreshold = 96 * 1024; // bytes

    //qDebug() << "unreachable bytes:" << unreachableCharacterCount * sizeof(QChar) << " -- limit" << garbageCollectionThreshold << "text size =" << text.size() << "capacity:" << text.capacity();

    bool compressTable = unreachableCharacterCount * sizeof(QChar) > garbageCollectionThreshold
                         && text.size() >= text.capacity() * 0.9;
    if (!compressTable)
        return;

    QString newText;
    newText.resize(text.size());
    QChar *newTextPtr = newText.data();
    int newLen = 0;

    for (FragmentMap::Iterator it = fragments.begin(); !it.atEnd(); ++it) {
        memcpy(newTextPtr, text.constData() + it->stringPosition, it->size_array[0] * sizeof(QChar));
        it->stringPosition = newLen;
        newTextPtr += it->size_array[0];
        newLen += it->size_array[0];
    }

    newText.resize(newLen);
    newText.squeeze();
    //qDebug() << "removed" << text.size() - newText.size() << "characters";
    text = newText;
    unreachableCharacterCount = 0;
}